

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_DebugStringReservedRangeMax_Test::
~ValidationErrorTest_DebugStringReservedRangeMax_Test
          (ValidationErrorTest_DebugStringReservedRangeMax_Test *this)

{
  (this->super_ValidationErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_01884b50;
  DescriptorPool::~DescriptorPool(&(this->super_ValidationErrorTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, DebugStringReservedRangeMax) {
  const FileDescriptor* file = BuildFile(absl::Substitute(
      "name: \"foo.proto\" "
      "enum_type { "
      "  name: \"Bar\""
      "  value { name:\"BAR\" number:1 }"
      "  reserved_range { start: 5 end: $0 }"
      "}"
      "message_type {"
      "  name: \"Foo\""
      "  reserved_range { start: 5 end: $1 }"
      "}",
      std::numeric_limits<int>::max(), FieldDescriptor::kMaxNumber + 1));

  ASSERT_EQ(
      "syntax = \"proto2\";\n\n"
      "enum Bar {\n"
      "  BAR = 1;\n"
      "  reserved 5 to max;\n"
      "}\n\n"
      "message Foo {\n"
      "  reserved 5 to max;\n"
      "}\n\n",
      file->DebugString());
}